

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementSpring.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementSpring::GetStateBlock(ChElementSpring *this,ChVectorDynamic<> *mD)

{
  long lVar1;
  element_type *peVar2;
  int iVar3;
  double *pdVar4;
  Index index;
  ulong uVar5;
  ActualDstType actualDst;
  ulong uVar6;
  
  iVar3 = (*(this->super_ChElementGeneric).super_ChElementBase._vptr_ChElementBase[3])();
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)iVar3);
  lVar1 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (lVar1 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (lVar1 != 0) {
    memset((mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data,0,
           lVar1 * 8);
  }
  if (2 < lVar1) {
    pdVar4 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    uVar5 = 3;
    if ((((ulong)pdVar4 & 7) == 0) &&
       (uVar6 = (ulong)(-((uint)((ulong)pdVar4 >> 3) & 0x1fffffff) & 7), uVar6 < 3)) {
      uVar5 = uVar6;
    }
    peVar2 = (((this->nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (uVar5 != 0) {
      uVar6 = 0;
      do {
        pdVar4[uVar6] = *(double *)(&(peVar2->super_ChNodeFEAbase).field_0x20 + uVar6 * 8);
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
    }
    if (uVar5 < 3) {
      do {
        pdVar4[uVar5] = *(double *)(&(peVar2->super_ChNodeFEAbase).field_0x20 + uVar5 * 8);
        uVar5 = uVar5 + 1;
      } while (uVar5 != 3);
    }
    if (5 < (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      pdVar4 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               + 3;
      uVar5 = 3;
      if ((((ulong)pdVar4 & 7) == 0) &&
         (uVar6 = (ulong)(-((uint)((ulong)pdVar4 >> 3) & 0x1fffffff) & 7), uVar6 < 3)) {
        uVar5 = uVar6;
      }
      peVar2 = (this->nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].
               super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (uVar5 != 0) {
        uVar6 = 0;
        do {
          pdVar4[uVar6] = *(double *)(&(peVar2->super_ChNodeFEAbase).field_0x20 + uVar6 * 8);
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
      }
      if (uVar5 < 3) {
        do {
          pdVar4[uVar5] = *(double *)(&(peVar2->super_ChNodeFEAbase).field_0x20 + uVar5 * 8);
          uVar5 = uVar5 + 1;
        } while (uVar5 != 3);
      }
      return;
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChElementSpring::GetStateBlock(ChVectorDynamic<>& mD) {
    mD.setZero(this->GetNdofs());
    mD.segment(0, 3) = this->nodes[0]->GetPos().eigen();
    mD.segment(3, 3) = this->nodes[1]->GetPos().eigen();
}